

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TestGroupStats_00a1ba60;
  Totals::~Totals((Totals *)0x261e7a);
  GroupInfo::~GroupInfo((GroupInfo *)0x261e88);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() = default;